

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          *enum_generators,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  EnumDescriptor *pEVar1;
  FieldDescriptor *pFVar2;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
  *pvVar3;
  EnumGenerator *this_00;
  Descriptor *pDVar4;
  ExtensionGenerator *this_01;
  long lVar5;
  long lVar6;
  _Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false> local_58;
  vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
  *local_50;
  Options *local_48;
  MessageGenerator *local_40;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
  *local_38;
  
  pDVar4 = this->descriptor_;
  local_38 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
              *)extension_generators;
  if (0 < pDVar4->enum_type_count_) {
    local_48 = &this->options_;
    local_50 = (vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
                *)&this->enum_generators_;
    lVar5 = 0;
    lVar6 = 0;
    local_40 = this;
    do {
      pEVar1 = pDVar4->enum_types_;
      this_00 = (EnumGenerator *)operator_new(0x110);
      EnumGenerator::EnumGenerator
                (this_00,(EnumDescriptor *)(&pEVar1->super_SymbolBase + lVar5),local_48);
      local_58._M_head_impl = this_00;
      std::
      vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>
                ((vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
                  *)enum_generators,
                 (unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                  *)&local_58);
      std::
      unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                     *)&local_58);
      local_58._M_head_impl =
           (enum_generators->
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
           _M_head_impl;
      std::
      vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
      ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator_const*>
                (local_50,&local_58._M_head_impl);
      lVar6 = lVar6 + 1;
      pDVar4 = local_40->descriptor_;
      lVar5 = lVar5 + 0x58;
      this = local_40;
    } while (lVar6 < pDVar4->enum_type_count_);
  }
  pDVar4 = this->descriptor_;
  if (0 < pDVar4->extension_count_) {
    local_48 = &this->options_;
    local_50 = (vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
                *)&this->extension_generators_;
    lVar6 = 0;
    lVar5 = 0;
    do {
      pFVar2 = pDVar4->extensions_;
      this_01 = (ExtensionGenerator *)operator_new(0x128);
      ExtensionGenerator::ExtensionGenerator
                (this_01,(FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar6),local_48,
                 this->scc_analyzer_);
      pvVar3 = local_38;
      local_58._M_head_impl = (EnumGenerator *)this_01;
      std::
      vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>
                (local_38,(unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                           *)&local_58);
      std::
      unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                     *)&local_58);
      local_58._M_head_impl = *(EnumGenerator **)(*(long *)(pvVar3 + 8) + -8);
      std::
      vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
      ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator_const*>
                ((vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
                  *)local_50,(ExtensionGenerator **)&local_58);
      lVar5 = lVar5 + 1;
      pDVar4 = this->descriptor_;
      lVar6 = lVar6 + 0x58;
    } while (lVar5 < pDVar4->extension_count_);
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<std::unique_ptr<EnumGenerator>>* enum_generators,
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); ++i) {
    enum_generators->emplace_back(
        std::make_unique<EnumGenerator>(descriptor_->enum_type(i), options_));
    enum_generators_.push_back(enum_generators->back().get());
  }
  for (int i = 0; i < descriptor_->extension_count(); ++i) {
    extension_generators->emplace_back(std::make_unique<ExtensionGenerator>(
        descriptor_->extension(i), options_, scc_analyzer_));
    extension_generators_.push_back(extension_generators->back().get());
  }
}